

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaItemListAddSize(xmlSchemaItemListPtr list,int initialSize,void *item)

{
  int iVar1;
  
  if ((list->sizeItems <= list->nbItems) &&
     (iVar1 = xmlSchemaItemListGrow(list,initialSize), iVar1 < 0)) {
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x10,
                        (xmlError *)0x0);
    return -1;
  }
  iVar1 = list->nbItems;
  list->nbItems = iVar1 + 1;
  list->items[iVar1] = item;
  return 0;
}

Assistant:

static int
xmlSchemaItemListAddSize(xmlSchemaItemListPtr list,
			 int initialSize,
			 void *item)
{
    if (list->sizeItems <= list->nbItems) {
        if (xmlSchemaItemListGrow(list, initialSize) < 0) {
	    xmlSchemaPErrMemory(NULL);
	    return(-1);
        }
    }

    list->items[list->nbItems++] = item;
    return(0);
}